

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

void __thiscall
Sudoku::createFieldCopy
          (Sudoku *this,
          vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *copiedFields)

{
  bool bVar1;
  int iVar2;
  __shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  element_type *this_00;
  reference psVar5;
  shared_ptr<Field> local_100;
  __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
  local_f0;
  __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
  local_e8;
  iterator iter_copy;
  int id;
  shared_ptr<Field> *dependency;
  iterator __end2;
  iterator __begin2;
  set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_> *__range2;
  Field *new_field_1;
  Field *field_1;
  iterator iter_1;
  iterator iter_new;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  undefined1 local_38 [8];
  shared_ptr<Field> new_field;
  Field *field;
  iterator iter;
  vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *copiedFields_local;
  Sudoku *this_local;
  
  field = (Field *)(this->field_begin_)._M_current;
  iter._M_current = (shared_ptr<Field> *)copiedFields;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
                             *)&field,&this->field_end_), bVar1) {
    p_Var3 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             __gnu_cxx::
             __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
             ::operator*((__normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
                          *)&field);
    new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                   (p_Var3);
    local_3c = Field::id((Field *)new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi);
    local_40 = Field::pos_x((Field *)new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    local_44 = Field::pos_y((Field *)new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    local_48 = Field::pos_z((Field *)new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    Field::max_value((Field *)new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi);
    std::make_shared<Field,int,int,int,int,int>
              ((int *)local_38,&local_3c,&local_40,&local_44,&local_48);
    bVar1 = Field::fixed((Field *)new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi);
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_38);
      iVar2 = Field::value((Field *)new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi);
      Field::setValue(peVar4,iVar2);
      peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_38);
      Field::setFixed(peVar4,true);
    }
    std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::push_back
              ((vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *)
               iter._M_current,(value_type *)local_38);
    std::shared_ptr<Field>::~shared_ptr((shared_ptr<Field> *)local_38);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
                  *)&field,0);
  }
  iter_1 = std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::begin
                     ((vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *)
                      iter._M_current);
  field_1 = (Field *)(this->field_begin_)._M_current;
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
                        *)&field_1,&this->field_end_);
    if (!bVar1) {
      return;
    }
    p_Var3 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             __gnu_cxx::
             __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
             ::operator*((__normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
                          *)&field_1);
    peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       (p_Var3);
    p_Var3 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             __gnu_cxx::
             __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
             ::operator*(&iter_1);
    this_00 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                        (p_Var3);
    Field::dependencies((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                         *)&__begin2,peVar4);
    __end2 = std::
             set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>::
             begin((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                    *)&__begin2);
    dependency = (shared_ptr<Field> *)
                 std::
                 set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                 ::end((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                        *)&__begin2);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&dependency), bVar1) {
      p_Var3 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::_Rb_tree_const_iterator<std::shared_ptr<Field>_>::operator*(&__end2);
      peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var3);
      iter_copy._M_current._4_4_ = Field::id(peVar4);
      local_e8._M_current =
           (shared_ptr<Field> *)
           std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::begin
                     ((vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *)
                      iter._M_current);
      while( true ) {
        local_f0._M_current =
             (shared_ptr<Field> *)
             std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::end
                       ((vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *)
                        iter._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_e8,&local_f0);
        if (!bVar1) break;
        p_Var3 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 __gnu_cxx::
                 __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
                 ::operator*(&local_e8);
        peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        iVar2 = Field::id(peVar4);
        if (iVar2 == iter_copy._M_current._4_4_) {
          psVar5 = __gnu_cxx::
                   __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
                   ::operator*(&local_e8);
          std::shared_ptr<Field>::shared_ptr(&local_100,psVar5);
          Field::addDependency(this_00,&local_100);
          std::shared_ptr<Field>::~shared_ptr(&local_100);
          break;
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
        ::operator++(&local_e8,0);
      }
      std::_Rb_tree_const_iterator<std::shared_ptr<Field>_>::operator++(&__end2);
    }
    std::set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>::~set
              ((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                *)&__begin2);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
                  *)&field_1,0);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
    ::operator++(&iter_1,0);
  } while( true );
}

Assistant:

void Sudoku::createFieldCopy(std::vector<std::shared_ptr<Field>> &copiedFields)
{
  // create new copy of fields
  for(FieldVector::iterator iter = field_begin_; iter != field_end_; iter++)
  {
    Field &field = **iter;
    // create new field with same properties as field
    std::shared_ptr<Field> new_field = std::make_shared<Field>(field.id(), field.pos_x(), field.pos_y(), field.pos_z(),
      field.max_value());

    // copy fixed state
    if(field.fixed())
    {
      new_field->setValue(field.value());
      new_field->setFixed(true);
    }

    copiedFields.push_back(new_field);
  }

  // create copy of dependencies
  FieldVector::iterator iter_new = copiedFields.begin();
  for(FieldVector::iterator iter = field_begin_; iter != field_end_; iter++, iter_new++)
  {
    Field &field = **iter;
    Field &new_field = **iter_new;
    // loop over all dependencies
    for(auto &dependency: field.dependencies())
    {
      int id = dependency->id();

      // find field with that id in copiedFields
      for(FieldVector::iterator iter_copy = copiedFields.begin(); iter_copy != copiedFields.end(); iter_copy++)
      {
        if((*iter_copy)->id() == id)
        {
          new_field.addDependency((*iter_copy));
          break;
        }
      }
    }
  }
}